

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int growOpArray(Vdbe *v,int nOp)

{
  undefined1 auVar1 [16];
  int iVar2;
  sqlite3 *db;
  void *pvVar3;
  long in_RDI;
  sqlite3_int64 nNew;
  Parse *p;
  VdbeOp *pNew;
  sqlite3 *db_00;
  int local_4;
  
  db_00 = *(sqlite3 **)(in_RDI + 0x18);
  if (*(int *)(in_RDI + 0x94) == 0) {
    db = (sqlite3 *)0x2a;
  }
  else {
    db = (sqlite3 *)((long)*(int *)(in_RDI + 0x94) << 1);
  }
  if ((long)*(int *)((long)&db_00->pVfs->xGetSystemCall + 4) < (long)db) {
    sqlite3OomFault(db);
    local_4 = 7;
  }
  else {
    pvVar3 = sqlite3DbRealloc(db_00,db,(u64)db);
    if (pvVar3 != (void *)0x0) {
      iVar2 = sqlite3DbMallocSize(db,(void *)0x1a2122);
      *(int *)&db_00->szMmap = iVar2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)db_00->szMmap;
      *(int *)(in_RDI + 0x94) = SUB164(auVar1 / ZEXT816(0x18),0);
      *(void **)(in_RDI + 0x88) = pvVar3;
    }
    local_4 = 7;
    if (pvVar3 != (void *)0x0) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int growOpArray(Vdbe *v, int nOp){
  VdbeOp *pNew;
  Parse *p = v->pParse;

  /* The SQLITE_TEST_REALLOC_STRESS compile-time option is designed to force
  ** more frequent reallocs and hence provide more opportunities for
  ** simulated OOM faults.  SQLITE_TEST_REALLOC_STRESS is generally used
  ** during testing only.  With SQLITE_TEST_REALLOC_STRESS grow the op array
  ** by the minimum* amount required until the size reaches 512.  Normal
  ** operation (without SQLITE_TEST_REALLOC_STRESS) is to double the current
  ** size of the op array or add 1KB of space, whichever is smaller. */
#ifdef SQLITE_TEST_REALLOC_STRESS
  sqlite3_int64 nNew = (v->nOpAlloc>=512 ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)v->nOpAlloc+nOp);
#else
  sqlite3_int64 nNew = (v->nOpAlloc ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)(1024/sizeof(Op)));
  UNUSED_PARAMETER(nOp);
#endif

  /* Ensure that the size of a VDBE does not grow too large */
  if( nNew > p->db->aLimit[SQLITE_LIMIT_VDBE_OP] ){
    sqlite3OomFault(p->db);
    return SQLITE_NOMEM;
  }

  assert( nOp<=(int)(1024/sizeof(Op)) );
  assert( nNew>=(v->nOpAlloc+nOp) );
  pNew = sqlite3DbRealloc(p->db, v->aOp, nNew*sizeof(Op));
  if( pNew ){
    p->szOpAlloc = sqlite3DbMallocSize(p->db, pNew);
    v->nOpAlloc = p->szOpAlloc/sizeof(Op);
    v->aOp = pNew;
  }
  return (pNew ? SQLITE_OK : SQLITE_NOMEM_BKPT);
}